

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O3

void If_ObjPerformMappingChoice(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess)

{
  short *psVar1;
  If_Obj_t **ppIVar2;
  short sVar3;
  If_Set_t *pCutSet;
  If_Cut_t *__src;
  If_Cut_t *pCut;
  int iVar4;
  If_Obj_t *pIVar5;
  If_Set_t *pIVar6;
  If_Par_t *pIVar7;
  long lVar8;
  uint fSaveCut0;
  float fVar9;
  
  pIVar7 = p->pPars;
  fSaveCut0 = 1;
  if ((((pIVar7->fDelayOpt == 0) && (pIVar7->fDelayOptLut == 0)) && (pIVar7->fDsdBalance == 0)) &&
     (pIVar7->fUserRecLib == 0)) {
    fSaveCut0 = (uint)(pIVar7->fUse34Spec != 0);
  }
  if (pObj->pEquiv == (If_Obj_t *)0x0) {
    __assert_fail("pObj->pEquiv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,0x1a9,"void If_ObjPerformMappingChoice(If_Man_t *, If_Obj_t *, int, int)");
  }
  pIVar5 = pObj;
  if ((Mode != 0) && (0 < pObj->nRefs)) {
    If_CutAreaDeref(p,&pObj->CutBest);
  }
  do {
    psVar1 = &pIVar5->pCutSet->nCuts;
    *psVar1 = *psVar1 + -1;
    ppIVar2 = &pIVar5->pEquiv;
    pIVar5 = *ppIVar2;
  } while (*ppIVar2 != (If_Obj_t *)0x0);
  pIVar5 = pObj->pEquiv;
  pCutSet = pObj->pCutSet;
  do {
    if (pIVar5 == (If_Obj_t *)0x0) {
      if (pCutSet->nCuts < 1) {
        __assert_fail("pCutSet->nCuts > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                      ,0x1d9,"void If_ObjPerformMappingChoice(If_Man_t *, If_Obj_t *, int, int)");
      }
      if ((fPreprocess == 0) || ((*pCutSet->ppCuts)->Delay <= pObj->Required + p->fEpsilon)) {
        memcpy(&pObj->CutBest,*pCutSet->ppCuts,(long)p->nCutBytes);
      }
      if (((pObj->field_0x1 & 0x10) == 0) && (0x1ffffff < *(uint *)&(pObj->CutBest).field_0x1c)) {
        sVar3 = pCutSet->nCuts;
        pCutSet->nCuts = sVar3 + 1;
        If_ManSetupCutTriv(p,pCutSet->ppCuts[sVar3],pObj->Id);
        if (pCutSet->nCutsMax + 1 < (int)pCutSet->nCuts) {
          __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                        ,0x1e2,"void If_ObjPerformMappingChoice(If_Man_t *, If_Obj_t *, int, int)");
        }
      }
      if ((Mode != 0) && (0 < pObj->nRefs)) {
        If_CutAreaRef(p,&pObj->CutBest);
      }
      If_ManDerefChoiceCutSet(p,pObj);
      return;
    }
    pIVar6 = pIVar5->pCutSet;
    if (0 < pIVar6->nCuts) {
      lVar8 = 0;
      do {
        __src = pIVar6->ppCuts[lVar8];
        if (__src == (If_Cut_t *)0x0) break;
        if ((__src->field_0x1d & 0x40) == 0) {
          if (pCutSet->nCutsMax < pCutSet->nCuts) {
            __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                          ,0x1c1,"void If_ObjPerformMappingChoice(If_Man_t *, If_Obj_t *, int, int)"
                         );
          }
          pCut = pCutSet->ppCuts[pCutSet->nCuts];
          memcpy(pCut,__src,(long)p->nCutBytes);
          iVar4 = If_CutFilter(pCutSet,pCut,fSaveCut0);
          if ((iVar4 == 0) && ((Mode == 0 || (pCut->Delay <= pObj->Required + p->fEpsilon)))) {
            *(uint *)&pCut->field_0x1c =
                 *(uint *)&pCut->field_0x1c & 0xffffefff |
                 ((*(uint *)pIVar5 ^ *(uint *)pObj) & 0x40) << 6;
            if (Mode == 2) {
              fVar9 = If_CutAreaDerefed(p,pCut);
              pCut->Area = fVar9;
              pIVar7 = p->pPars;
              if (pIVar7->fEdge != 0) {
                fVar9 = If_CutEdgeDerefed(p,pCut);
                pCut->Edge = fVar9;
                pIVar7 = p->pPars;
              }
              if (pIVar7->fPower != 0) {
                fVar9 = If_CutPowerDerefed(p,pCut,pObj);
LAB_003afa49:
                pCut->Power = fVar9;
              }
            }
            else {
              fVar9 = If_CutAreaFlow(p,pCut);
              pCut->Area = fVar9;
              pIVar7 = p->pPars;
              if (pIVar7->fEdge != 0) {
                fVar9 = If_CutEdgeFlow(p,pCut);
                pCut->Edge = fVar9;
                pIVar7 = p->pPars;
              }
              if (pIVar7->fPower != 0) {
                fVar9 = If_CutPowerFlow(p,pCut,pObj);
                goto LAB_003afa49;
              }
            }
            If_CutSort(p,pCutSet,pCut);
          }
        }
        lVar8 = lVar8 + 1;
        pIVar6 = pIVar5->pCutSet;
      } while (lVar8 < pIVar6->nCuts);
    }
    pIVar5 = pIVar5->pEquiv;
  } while( true );
}

Assistant:

void If_ObjPerformMappingChoice( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess )
{
    If_Set_t * pCutSet;
    If_Obj_t * pTemp;
    If_Cut_t * pCutTemp, * pCut;
    int i, fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUse34Spec;
    assert( pObj->pEquiv != NULL );

    // prepare
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // remove elementary cuts
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
        pTemp->pCutSet->nCuts--;

    // update the cutset of the node
    pCutSet = pObj->pCutSet;

    // generate cuts
    for ( pTemp = pObj->pEquiv; pTemp; pTemp = pTemp->pEquiv )
    {
        if ( pTemp->pCutSet->nCuts == 0 )
            continue;
        // go through the cuts of this node
        If_ObjForEachCut( pTemp, pCutTemp, i )
        {
            if ( pCutTemp->fUseless )
                continue;
            // get the next free cut
            assert( pCutSet->nCuts <= pCutSet->nCutsMax );
            pCut = pCutSet->ppCuts[pCutSet->nCuts];
            // copy the cut into storage
            If_CutCopy( p, pCut, pCutTemp );
            // check if this cut is contained in any of the available cuts
            if ( If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            // check if the cut satisfies the required times
//            assert( pCut->Delay == If_CutDelay( p, pTemp, pCut ) );
            if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
                continue;
            // set the phase attribute
            pCut->fCompl = pObj->fPhase ^ pTemp->fPhase;
            // compute area of the cut (this area may depend on the application specific cost)
            pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
            if ( p->pPars->fEdge )
                pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
            if ( p->pPars->fPower )
                pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//            pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
            // insert the cut into storage
            If_CutSort( p, pCutSet, pCut );
        }
    } 
    assert( pCutSet->nCuts > 0 );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    // free the cuts
    If_ManDerefChoiceCutSet( p, pObj );
}